

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_add_cast(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_type type)

{
  ggml_type gVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  
  if (b->ne[0] == a->ne[0]) {
    _Var2 = ggml_can_repeat(b,a);
    if (_Var2) {
      gVar1 = a->type;
      if (((type_traits[gVar1].is_quantized != false) || (gVar1 == GGML_TYPE_F16)) ||
         (gVar1 == GGML_TYPE_BF16)) {
        pgVar3 = ggml_new_tensor(ctx,type,4,a->ne);
        pgVar3->op = GGML_OP_ADD;
        pgVar3->src[0] = a;
        pgVar3->src[1] = b;
        return pgVar3;
      }
      pcVar4 = "ggml_is_quantized(a->type) || a->type == GGML_TYPE_F16 || a->type == GGML_TYPE_BF16"
      ;
      line = 0x76a;
      goto LAB_00120717;
    }
  }
  pcVar4 = "ggml_can_repeat_rows(b, a)";
  line = 0x765;
LAB_00120717:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

static inline bool ggml_can_repeat_rows(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return (t0->ne[0] == t1->ne[0]) && ggml_can_repeat(t0, t1);
}